

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

void __thiscall slang::ast::PulseStyleSymbol::resolve(PulseStyleSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  Scope *parentParent;
  LookupLocation LVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar4;
  ASTContext context;
  
  this->isResolved = true;
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  parentParent = pSVar1->thisSym->parentScope;
  LVar3 = LookupLocation::after(&this->super_Symbol);
  context.lookupIndex = LVar3.index;
  context.flags.m_bits = 0x400000020;
  context.instanceOrProc = (Symbol *)0x0;
  context.firstTempVar = (TempVarSymbol *)0x0;
  context.randomizeDetails = (RandomizeDetails *)0x0;
  context.assertionInstance = (AssertionInstanceDetails *)0x0;
  context.scope.ptr = pSVar1;
  sVar4 = bindTerminals((SeparatedSyntaxList<slang::syntax::NameSyntax> *)(pSVar2 + 4),Output,
                        parentParent,&context);
  this->terminals = sVar4;
  return;
}

Assistant:

void PulseStyleSymbol::resolve() const {
    isResolved = true;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<PulseStyleDeclarationSyntax>();
    terminals = bindTerminals(syntax.inputs, SpecifyBlockSymbol::SpecifyTerminalDir::Output,
                              parentParent, context);
}